

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZSavable_019625a0;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::TPZMultiphysicsCompEl
            (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>,&PTR_PTR_01961b80,mesh,
             &copy->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZCompElWithMem_01961870;
  TPZVec<long>::TPZVec((TPZVec<long> *)&this->fIntPtIndices,0);
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore =
       (this->fIntPtIndices).super_TPZManVector<long,_128>.fExtAlloc;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNAlloc = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01962610;
  CopyIntPtIndicesFrom(this,copy);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh,
                                          const TPZCompElWithMem<TBASE> &copy,
                                          std::map<int64_t,int64_t> & gl2lcConMap,
                                          std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh,copy,gl2lcConMap,gl2lcElMap)
{
    CopyIntPtIndicesFrom(copy);
}